

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::pushInheritedAttributesToPage(QPDF *this,bool allow_changes,bool warn_skipped_keys)

{
  bool bVar1;
  pointer pMVar2;
  logic_error *this_00;
  allocator<char> local_c1;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [32];
  string local_68;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  key_ancestors;
  bool warn_skipped_keys_local;
  bool allow_changes_local;
  QPDF *this_local;
  
  key_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = warn_skipped_keys;
  key_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = allow_changes;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (((pMVar2->pushed_inherited_attributes_to_pages & 1U) == 0) ||
     ((key_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0)) {
    getAllPages(this);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
           *)local_48);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_88,"/Root",&local_89);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_68,(string *)&pMVar2->trailer);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"/Pages",&local_c1);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_68.field_2,&local_68);
    pushInheritedAttributesToPageInternal
              (this,(QPDFObjectHandle *)&local_68.field_2,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                *)local_48,
               (bool)(key_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
               (bool)(key_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_68.field_2);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_68);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                     *)local_48);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"key_ancestors not empty after pushing inherited attributes to pages");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar2->pushed_inherited_attributes_to_pages = true;
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar2->ever_pushed_inherited_attributes_to_pages = true;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
            *)local_48);
  }
  return;
}

Assistant:

void
QPDF::pushInheritedAttributesToPage(bool allow_changes, bool warn_skipped_keys)
{
    // Traverse pages tree pushing all inherited resources down to the page level.

    // The record of whether we've done this is cleared by updateAllPagesCache().  If we're warning
    // for skipped keys, re-traverse unconditionally.
    if (m->pushed_inherited_attributes_to_pages && (!warn_skipped_keys)) {
        return;
    }

    // Calling getAllPages() resolves any duplicated page objects, repairs broken nodes, and detects
    // loops, so we don't have to do those activities here.
    getAllPages();

    // key_ancestors is a mapping of page attribute keys to a stack of Pages nodes that contain
    // values for them.
    std::map<std::string, std::vector<QPDFObjectHandle>> key_ancestors;
    pushInheritedAttributesToPageInternal(
        m->trailer.getKey("/Root").getKey("/Pages"),
        key_ancestors,
        allow_changes,
        warn_skipped_keys);
    if (!key_ancestors.empty()) {
        throw std::logic_error(
            "key_ancestors not empty after pushing inherited attributes to pages");
    }
    m->pushed_inherited_attributes_to_pages = true;
    m->ever_pushed_inherited_attributes_to_pages = true;
}